

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumericTests.cpp
# Opt level: O3

void testDiv(SVInt *a,SVInt *b,SVInt *c)

{
  logic_t lVar1;
  char cVar2;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  AssertionHandler catchAssertionHandler;
  SVInt p;
  SVInt r;
  SVInt q;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_d8;
  uint local_d0;
  byte local_cb;
  char local_9d;
  long *local_98;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_90;
  uint local_88;
  byte local_83;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_80;
  uint local_78;
  byte local_73;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_70;
  uint local_68;
  byte local_63;
  ITransientExpression local_60;
  SVInt *local_50;
  char *local_48;
  undefined8 local_40;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 *local_38;
  
  local_60._vptr_ITransientExpression = (_func_int **)0x9f9d80;
  local_60.m_isBinaryExpression = true;
  local_60.m_result = true;
  local_60._10_6_ = 0;
  macroName.m_size = 7;
  macroName.m_start = "REQUIRE";
  capturedExpression.m_size = 6;
  capturedExpression.m_start = "a >= b";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_d8,macroName,(SourceLineInfo *)&local_60,capturedExpression,
             Normal);
  lVar1 = slang::SVInt::operator<(a,b);
  cVar2 = lVar1.value == '\0';
  if (lVar1.value == '@') {
    cVar2 = -0x80;
  }
  if (lVar1.value == 0x80) {
    cVar2 = -0x80;
  }
  local_60.m_result = cVar2 != '\0' && (cVar2 != '@' && cVar2 != -0x80);
  local_60.m_isBinaryExpression = true;
  local_60._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00c8a0a0;
  local_48 = ">=";
  local_40 = 2;
  local_50 = a;
  local_38 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)b;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&local_d8,&local_60);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_d8);
  if (local_9d == '\0') {
    (**(code **)(*local_98 + 0xa0))();
  }
  local_60._vptr_ITransientExpression = (_func_int **)0x9f9d80;
  local_60.m_isBinaryExpression = true;
  local_60.m_result = true;
  local_60._10_6_ = 0;
  macroName_00.m_size = 7;
  macroName_00.m_start = "REQUIRE";
  capturedExpression_00.m_size = 5;
  capturedExpression_00.m_start = "a > c";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_d8,macroName_00,(SourceLineInfo *)&local_60,
             capturedExpression_00,Normal);
  lVar1 = slang::SVInt::operator<=(a,c);
  cVar2 = lVar1.value == '\0';
  if (lVar1.value == '@') {
    cVar2 = -0x80;
  }
  if (lVar1.value == 0x80) {
    cVar2 = -0x80;
  }
  local_60.m_result = cVar2 != '\0' && (cVar2 != '@' && cVar2 != -0x80);
  local_60.m_isBinaryExpression = true;
  local_60._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00c8a0a0;
  local_48 = ">";
  local_40 = 1;
  local_50 = a;
  local_38 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)c;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&local_d8,&local_60);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_d8);
  if (local_9d == '\0') {
    (**(code **)(*local_98 + 0xa0))();
  }
  slang::SVInt::operator*((SVInt *)&local_d8,a);
  slang::SVInt::operator+((SVInt *)&local_90,(SVInt *)&local_d8);
  if (((0x40 < local_d0) || ((local_cb & 1) != 0)) && ((void *)local_d8.val != (void *)0x0)) {
    operator_delete__(local_d8.pVal);
  }
  slang::SVInt::operator/((SVInt *)&local_70,(SVInt *)&local_90);
  slang::SVInt::operator%((SVInt *)&local_80,(SVInt *)&local_90);
  local_60._vptr_ITransientExpression = (_func_int **)0x9f9d80;
  local_60.m_isBinaryExpression = true;
  local_60.m_result = true;
  local_60._10_6_ = 0;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 6;
  capturedExpression_01.m_start = "b == q";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_d8,macroName_01,(SourceLineInfo *)&local_60,
             capturedExpression_01,ContinueOnFailure);
  lVar1 = slang::SVInt::operator==(b,(SVInt *)&local_70);
  local_60.m_result = (lVar1.value != '\0' && lVar1.value != 0x80) && lVar1.value != '@';
  local_60.m_isBinaryExpression = true;
  local_60._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00c8d580;
  local_48 = "==";
  local_40 = 2;
  local_50 = b;
  local_38 = &local_70;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&local_d8,&local_60);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_d8);
  if (local_9d == '\0') {
    (**(code **)(*local_98 + 0xa0))();
  }
  local_60._vptr_ITransientExpression = (_func_int **)0x9f9d80;
  local_60.m_isBinaryExpression = true;
  local_60.m_result = true;
  local_60._10_6_ = 0;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 6;
  capturedExpression_02.m_start = "c == r";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_d8,macroName_02,(SourceLineInfo *)&local_60,
             capturedExpression_02,ContinueOnFailure);
  lVar1 = slang::SVInt::operator==(c,(SVInt *)&local_80);
  local_60.m_result = (lVar1.value != '\0' && lVar1.value != 0x80) && lVar1.value != '@';
  local_60.m_isBinaryExpression = true;
  local_60._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00c8d580;
  local_48 = "==";
  local_40 = 2;
  local_50 = c;
  local_38 = &local_80;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&local_d8,&local_60);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_d8);
  if (local_9d == '\0') {
    (**(code **)(*local_98 + 0xa0))();
  }
  lVar1 = slang::SVInt::operator<=(b,c);
  cVar2 = lVar1.value == '\0';
  if (lVar1.value == '@') {
    cVar2 = -0x80;
  }
  if (lVar1.value == 0x80) {
    cVar2 = -0x80;
  }
  if (((cVar2 != '\0') && (cVar2 != -0x80)) && (cVar2 != '@')) {
    slang::SVInt::operator/((SVInt *)&local_d8,(SVInt *)&local_90);
    slang::SVInt::operator=((SVInt *)&local_70,(SVInt *)&local_d8);
    if (((0x40 < local_d0) || ((local_cb & 1) != 0)) && ((void *)local_d8.val != (void *)0x0)) {
      operator_delete__(local_d8.pVal);
    }
    slang::SVInt::operator%((SVInt *)&local_d8,(SVInt *)&local_90);
    slang::SVInt::operator=((SVInt *)&local_80,(SVInt *)&local_d8);
    if (((0x40 < local_d0) || ((local_cb & 1) != 0)) && ((void *)local_d8.val != (void *)0x0)) {
      operator_delete__(local_d8.pVal);
    }
    local_60._vptr_ITransientExpression = (_func_int **)0x9f9d80;
    local_60.m_isBinaryExpression = true;
    local_60.m_result = true;
    local_60._10_6_ = 0;
    macroName_03.m_size = 5;
    macroName_03.m_start = "CHECK";
    capturedExpression_03.m_size = 6;
    capturedExpression_03.m_start = "a == q";
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_d8,macroName_03,(SourceLineInfo *)&local_60,
               capturedExpression_03,ContinueOnFailure);
    lVar1 = slang::SVInt::operator==(a,(SVInt *)&local_70);
    local_60.m_result = (lVar1.value != '\0' && lVar1.value != 0x80) && lVar1.value != '@';
    local_60.m_isBinaryExpression = true;
    local_60._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00c8d580;
    local_48 = "==";
    local_40 = 2;
    local_50 = a;
    local_38 = &local_70;
    Catch::AssertionHandler::handleExpr((AssertionHandler *)&local_d8,&local_60);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_d8);
    if (local_9d == '\0') {
      (**(code **)(*local_98 + 0xa0))();
    }
    local_60._vptr_ITransientExpression = (_func_int **)0x9f9d80;
    local_60.m_isBinaryExpression = true;
    local_60.m_result = true;
    local_60._10_6_ = 0;
    macroName_04.m_size = 5;
    macroName_04.m_start = "CHECK";
    capturedExpression_04.m_size = 6;
    capturedExpression_04.m_start = "c == r";
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_d8,macroName_04,(SourceLineInfo *)&local_60,
               capturedExpression_04,ContinueOnFailure);
    lVar1 = slang::SVInt::operator==(c,(SVInt *)&local_80);
    local_60.m_result = (lVar1.value != '\0' && lVar1.value != 0x80) && lVar1.value != '@';
    local_60.m_isBinaryExpression = true;
    local_60._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00c8d580;
    local_48 = "==";
    local_40 = 2;
    local_50 = c;
    local_38 = &local_80;
    Catch::AssertionHandler::handleExpr((AssertionHandler *)&local_d8,&local_60);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_d8);
    if (local_9d == '\0') {
      (**(code **)(*local_98 + 0xa0))();
    }
  }
  if (((0x40 < local_78) || ((local_73 & 1) != 0)) && ((void *)local_80.val != (void *)0x0)) {
    operator_delete__(local_80.pVal);
  }
  if (((0x40 < local_68) || ((local_63 & 1) != 0)) && ((void *)local_70.val != (void *)0x0)) {
    operator_delete__(local_70.pVal);
  }
  if (((0x40 < local_88) || ((local_83 & 1) != 0)) && ((void *)local_90.val != (void *)0x0)) {
    operator_delete__(local_90.pVal);
  }
  return;
}

Assistant:

void testDiv(const SVInt& a, const SVInt& b, const SVInt& c) {
    // Test division and remainder using: (a * b + c) / a
    REQUIRE(a >= b);
    REQUIRE(a > c);

    auto p = a * b + c;
    auto q = p / a;
    auto r = p % a;
    CHECK(b == q);
    CHECK(c == r);

    if (b > c) {
        q = p / b;
        r = p % b;
        CHECK(a == q);
        CHECK(c == r);
    }
}